

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O3

void __thiscall
just::test::assertion_failed::assertion_failed
          (assertion_failed *this,string *msg_,string *filename_,int line_)

{
  pointer pcVar1;
  
  (this->_msg)._M_dataplus._M_p = (pointer)&(this->_msg).field_2;
  pcVar1 = (msg_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + msg_->_M_string_length);
  (this->_filename)._M_dataplus._M_p = (pointer)&(this->_filename).field_2;
  pcVar1 = (filename_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_filename,pcVar1,pcVar1 + filename_->_M_string_length);
  this->_line = line_;
  return;
}

Assistant:

assertion_failed(
        const std::string& msg_,
        const std::string& filename_,
        int line_
      ) :
        _msg(msg_),
        _filename(filename_),
        _line(line_)
      {}